

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Trigger * sqlite3TriggersExist(Parse *pParse,Table *pTab,int op,ExprList *pChanges,int *pMask)

{
  byte bVar1;
  Schema *pSVar2;
  Trigger *pTVar3;
  int iVar4;
  uint uVar5;
  u8 uVar6;
  Trigger *pTVar7;
  char *pcVar8;
  Trigger *pTVar9;
  uint uVar10;
  bool bVar11;
  Trigger *pTStack_50;
  
  if (((pTab->pTrigger == (Trigger *)0x0) &&
      ((pSVar2 = pParse->db->aDb[1].pSchema, pSVar2 == (Schema *)0x0 ||
       ((pSVar2->trigHash).first == (HashElem *)0x0)))) || (pParse->disableTriggers != '\0')) {
    if (pMask != (int *)0x0) {
      *pMask = 0;
    }
    return (Trigger *)0x0;
  }
  pTStack_50 = sqlite3TriggerList(pParse,pTab);
  if (pTStack_50 == (Trigger *)0x0) {
LAB_001b1c11:
    uVar10 = 0;
    pTStack_50 = (Trigger *)0x0;
  }
  else {
    if (((pParse->db->flags & 0x40000) == 0) && (pTVar9 = pTab->pTrigger, pTVar9 != (Trigger *)0x0))
    {
      pTVar3 = pTStack_50;
      if (pTStack_50 == pTVar9) goto LAB_001b1c11;
      do {
        pTVar7 = pTVar3;
        pTVar3 = pTVar7->pNext;
        if (pTVar3 == (Trigger *)0x0) break;
      } while (pTVar3 != pTVar9);
      pTVar7->pNext = (Trigger *)0x0;
    }
    pcVar8 = "UPDATE";
    if (op == 0x80) {
      pcVar8 = "DELETE";
    }
    uVar10 = 0;
    pTVar9 = pTStack_50;
    do {
      bVar1 = pTVar9->op;
      if (((uint)bVar1 == op) && (iVar4 = checkColumnOverlap(pTVar9->pColumns,pChanges), iVar4 != 0)
         ) {
LAB_001b1b8c:
        uVar5 = (uint)pTVar9->tr_tm;
LAB_001b1bfa:
        uVar10 = uVar10 | uVar5;
      }
      else {
        if (bVar1 == 0x96) {
          pTVar9->op = (u8)op;
          bVar11 = pTab->eTabType != '\x01';
          if (op == 0x7f || bVar11) {
            uVar6 = bVar11 + '\x01';
            uVar5 = bVar11 + 1;
          }
          else {
            sqlite3ErrorMsg(pParse,"%s RETURNING is not available on virtual tables",pcVar8);
            uVar6 = '\x01';
            uVar5 = 1;
          }
          pTVar9->tr_tm = uVar6;
          goto LAB_001b1bfa;
        }
        if ((((pTVar9->bReturning != '\0') && (op == 0x81)) && (bVar1 == 0x7f)) &&
           (pParse->pToplevel == (Parse *)0x0)) goto LAB_001b1b8c;
      }
      pTVar9 = pTVar9->pNext;
    } while (pTVar9 != (Trigger *)0x0);
  }
  if (pMask != (int *)0x0) {
    *pMask = uVar10;
  }
  if (uVar10 == 0) {
    pTStack_50 = (Trigger *)0x0;
  }
  return pTStack_50;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggersExist(
  Parse *pParse,          /* Parse context */
  Table *pTab,            /* The table the contains the triggers */
  int op,                 /* one of TK_DELETE, TK_INSERT, TK_UPDATE */
  ExprList *pChanges,     /* Columns that change in an UPDATE statement */
  int *pMask              /* OUT: Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
){
  assert( pTab!=0 );
  if( (pTab->pTrigger==0 && !tempTriggersExist(pParse->db))
   || pParse->disableTriggers
  ){
    if( pMask ) *pMask = 0;
    return 0;
  }
  return triggersReallyExist(pParse,pTab,op,pChanges,pMask);
}